

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O1

void __thiscall duckdb_re2::DFA::DFA(DFA *this,Prog *prog,MatchKind kind,int64_t max_mem)

{
  Mutex *__rwlock;
  Prog *pPVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  Workq *pWVar5;
  int *piVar6;
  runtime_error *prVar7;
  long lVar8;
  size_type __n;
  new_allocator<int> local_45;
  Deleter local_44;
  CacheMutex *local_40;
  Mutex *local_38;
  
  this->prog_ = prog;
  this->kind_ = kind;
  this->init_failed_ = false;
  __rwlock = &this->mutex_;
  iVar3 = pthread_rwlock_init((pthread_rwlock_t *)__rwlock,(pthread_rwlockattr_t *)0x0);
  if (iVar3 != 0) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar7,"RE2 pthread failure");
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  *(undefined8 *)
   &(this->stack_).ptr_._M_t.super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
    super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter> = 0;
  (this->stack_).ptr_._M_t.super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
  super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
  super__Head_base<0UL,_int_*,_false>._M_head_impl = (int *)0x0;
  this->q0_ = (Workq *)0x0;
  this->q1_ = (Workq *)0x0;
  iVar3 = 0;
  iVar4 = pthread_rwlock_init((pthread_rwlock_t *)&this->cache_mutex_,(pthread_rwlockattr_t *)0x0);
  local_38 = __rwlock;
  if (iVar4 == 0) {
    this->mem_budget_ = max_mem;
    (this->state_cache_)._M_h._M_buckets = &(this->state_cache_)._M_h._M_single_bucket;
    (this->state_cache_)._M_h._M_bucket_count = 1;
    (this->state_cache_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (this->state_cache_)._M_h._M_element_count = 0;
    (this->state_cache_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (this->state_cache_)._M_h._M_rehash_policy._M_next_resize = 0;
    (this->state_cache_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    this->start_[0].start._M_b._M_p = (__pointer_type)0x0;
    this->start_[1].start._M_b._M_p = (__pointer_type)0x0;
    this->start_[2].start._M_b._M_p = (__pointer_type)0x0;
    this->start_[3].start._M_b._M_p = (__pointer_type)0x0;
    this->start_[4].start._M_b._M_p = (__pointer_type)0x0;
    this->start_[5].start._M_b._M_p = (__pointer_type)0x0;
    this->start_[6].start._M_b._M_p = (__pointer_type)0x0;
    this->start_[7].start._M_b._M_p = (__pointer_type)0x0;
    if (this->kind_ == kLongestMatch) {
      iVar3 = this->prog_->size_;
    }
    pPVar1 = this->prog_;
    local_44.len_ =
         pPVar1->inst_count_[6] + pPVar1->inst_count_[3] + iVar3 + pPVar1->inst_count_[4] + 1;
    this->mem_budget_ = max_mem + -0x128;
    __n = (size_type)local_44.len_;
    lVar8 = (max_mem + -0x128) - (((long)pPVar1->size_ + (long)iVar3) * 0x10 + __n * 4);
    this->mem_budget_ = lVar8;
    if ((-1 < lVar8) &&
       (this->state_budget_ = lVar8,
       (((long)pPVar1->list_count_ + (long)iVar3) * 4 + (long)pPVar1->bytemap_range_ * 8) * 0x14 +
       0x280 <= lVar8)) {
      local_40 = &this->cache_mutex_;
      pWVar5 = (Workq *)operator_new(0x38);
      iVar4 = pPVar1->size_;
      SparseSetT<void>::SparseSetT((SparseSetT<void> *)pWVar5,iVar4 + iVar3);
      pWVar5->n_ = iVar4;
      pWVar5->maxmark_ = iVar3;
      pWVar5->nextmark_ = iVar4;
      pWVar5->last_was_mark_ = true;
      this->q0_ = pWVar5;
      pWVar5 = (Workq *)operator_new(0x38);
      iVar4 = this->prog_->size_;
      SparseSetT<void>::SparseSetT((SparseSetT<void> *)pWVar5,iVar4 + iVar3);
      pWVar5->n_ = iVar4;
      pWVar5->maxmark_ = iVar3;
      pWVar5->nextmark_ = iVar4;
      pWVar5->last_was_mark_ = true;
      this->q1_ = pWVar5;
      piVar6 = __gnu_cxx::new_allocator<int>::allocate(&local_45,__n,(void *)0x0);
      piVar2 = (this->stack_).ptr_._M_t.
               super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
               super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
               super__Head_base<0UL,_int_*,_false>._M_head_impl;
      (this->stack_).ptr_._M_t.super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
      super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
      super__Head_base<0UL,_int_*,_false>._M_head_impl = piVar6;
      if (piVar2 != (int *)0x0) {
        operator_delete(piVar2);
      }
      (this->stack_).ptr_._M_t.super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
      super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
      super__Tuple_impl<1UL,_duckdb_re2::PODArray<int>::Deleter>.
      super__Head_base<1UL,_duckdb_re2::PODArray<int>::Deleter,_false> =
           (_Head_base<1UL,_duckdb_re2::PODArray<int>::Deleter,_false>)local_44.len_;
      return;
    }
    this->init_failed_ = true;
    return;
  }
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar7,"RE2 pthread failure");
  __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

DFA::DFA(Prog* prog, Prog::MatchKind kind, int64_t max_mem)
  : prog_(prog),
    kind_(kind),
    init_failed_(false),
    q0_(NULL),
    q1_(NULL),
    mem_budget_(max_mem) {
  int nmark = 0;
  if (kind_ == Prog::kLongestMatch)
    nmark = prog_->size();
  // See DFA::AddToQueue() for why this is so.
  int nstack = prog_->inst_count(kInstCapture) +
               prog_->inst_count(kInstEmptyWidth) +
               prog_->inst_count(kInstNop) +
               nmark + 1;  // + 1 for start inst

  // Account for space needed for DFA, q0, q1, stack.
  mem_budget_ -= sizeof(DFA);
  mem_budget_ -= (prog_->size() + nmark) *
                 (sizeof(int)+sizeof(int)) * 2;  // q0, q1
  mem_budget_ -= nstack * sizeof(int);  // stack
  if (mem_budget_ < 0) {
    init_failed_ = true;
    return;
  }

  state_budget_ = mem_budget_;

  // Make sure there is a reasonable amount of working room left.
  // At minimum, the search requires room for two states in order
  // to limp along, restarting frequently.  We'll get better performance
  // if there is room for a larger number of states, say 20.
  // Note that a state stores list heads only, so we use the program
  // list count for the upper bound, not the program size.
  int nnext = prog_->bytemap_range() + 1;  // + 1 for kByteEndText slot
  int64_t one_state = sizeof(State) + nnext*sizeof(std::atomic<State*>) +
                      (prog_->list_count()+nmark)*sizeof(int);
  if (state_budget_ < 20*one_state) {
    init_failed_ = true;
    return;
  }

  q0_ = new Workq(prog_->size(), nmark);
  q1_ = new Workq(prog_->size(), nmark);
  stack_ = PODArray<int>(nstack);
}